

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear_algebra.hpp
# Opt level: O2

matrix<int,_2UL> *
trng::operator*(matrix<int,_2UL> *__return_storage_ptr__,matrix<int,_2UL> *a,matrix<int,_2UL> *b)

{
  int *piVar1;
  pointer piVar2;
  bool bVar3;
  ulong uVar4;
  long lVar5;
  int iVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  size_type i_1;
  long lVar10;
  size_type j;
  ulong uStack_40;
  
  matrix<int,_2UL>::matrix(__return_storage_ptr__);
  bVar3 = true;
  uVar4 = 0;
  while (bVar3) {
    lVar5 = 0;
    for (lVar7 = 0; lVar7 != 2; lVar7 = lVar7 + 1) {
      piVar2 = (__return_storage_ptr__->data).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      for (uVar9 = uVar4; uVar9 < 2; uVar9 = uVar9 + 1) {
        *(undefined4 *)((long)piVar2 + uVar9 * 4 + lVar5) = 0;
      }
      lVar5 = lVar5 + 8;
    }
    bVar3 = true;
    uStack_40 = 0;
    while (bVar3) {
      lVar5 = 0;
      for (lVar7 = 0; lVar7 != 2; lVar7 = lVar7 + 1) {
        piVar2 = (__return_storage_ptr__->data).super__Vector_base<int,_std::allocator<int>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        lVar10 = uVar4 * 4;
        for (uVar9 = uVar4; uVar9 < 2; uVar9 = uVar9 + 1) {
          iVar6 = 0;
          for (uVar8 = uStack_40; uVar8 < 2; uVar8 = uVar8 + 1) {
            iVar6 = iVar6 + *(int *)((long)(b->data).super__Vector_base<int,_std::allocator<int>_>.
                                           _M_impl.super__Vector_impl_data._M_start +
                                    uVar8 * 8 + lVar10) *
                            *(int *)((long)(a->data).super__Vector_base<int,_std::allocator<int>_>.
                                           _M_impl.super__Vector_impl_data._M_start +
                                    uVar8 * 4 + lVar5);
          }
          piVar1 = piVar2 + lVar7 * 2 + uVar9;
          *piVar1 = *piVar1 + iVar6;
          lVar10 = lVar10 + 4;
        }
        lVar5 = lVar5 + 8;
      }
      bVar3 = false;
      uStack_40 = 0x20;
    }
    bVar3 = false;
    uStack_40 = 0x20;
    uVar4 = uStack_40;
  }
  return __return_storage_ptr__;
}

Assistant:

matrix<T, n> operator*(const matrix<T, n> &a, const matrix<T, n> &b) {
    using size_type = typename matrix<T, n>::size_type;
    matrix<T, n> res;
    const size_type step{32};
    for (size_type j0{0}; j0 < n; j0 += step) {
      for (size_type i{0}; i < n; ++i)
        for (size_type j{j0}, j_end{utility::min(n, j0 + step)}; j < j_end; ++j)
          res(i, j) = T{0};
      for (size_type k0{0}; k0 < n; k0 += step) {
        for (size_type i{0}; i < n; ++i)
          for (size_type j{j0}, j_end{utility::min(n, j0 + step)}; j < j_end; ++j) {
            T sum{0};
            for (size_type k{k0}, k_end{utility::min(n, k0 + step)}; k < k_end; ++k)
              sum = sum + a(i, k) * b(k, j);
            res(i, j) = res(i, j) + sum;
          }
      }
    }
    return res;
  }